

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_1::PosixEnv::Schedule
          (PosixEnv *this,_func_void_void_ptr *background_work_function,void *background_work_arg)

{
  PosixEnv *this_00;
  _Map_pointer __src;
  ulong uVar1;
  int iVar2;
  int extraout_EAX;
  _Map_pointer ppBVar3;
  BackgroundWorkItem *pBVar4;
  undefined8 uVar5;
  _Elt_pointer pBVar6;
  size_t sVar7;
  long lVar8;
  _Map_pointer ppBVar9;
  long lVar10;
  _Map_pointer __dest;
  long in_FS_OFFSET;
  thread background_thread;
  long local_48;
  long *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->background_work_mutex_);
  if (iVar2 == 0) {
    if (this->started_background_thread_ == false) {
      this->started_background_thread_ = true;
      local_48 = 0;
      local_40 = (long *)operator_new(0x18);
      *local_40 = (long)&PTR___State_013bb018;
      local_40[1] = (long)this;
      local_40[2] = (long)BackgroundThreadEntryPoint;
      std::thread::_M_start_thread(&local_48,&local_40,0);
      if (local_40 != (long *)0x0) {
        (**(code **)(*local_40 + 8))();
      }
      std::thread::detach();
      if (local_48 != 0) goto LAB_00d285cb;
    }
    if ((this->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      std::condition_variable::notify_one();
    }
    pBVar6 = (this->background_work_queue_).c.
             super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pBVar6 == (this->background_work_queue_).c.
                  super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ppBVar9 = (this->background_work_queue_).c.
                super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      __src = (this->background_work_queue_).c.
              super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
      lVar10 = (long)ppBVar9 - (long)__src >> 3;
      if (((long)(this->background_work_queue_).c.
                 super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->background_work_queue_).c.
                 super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
          ((long)pBVar6 -
           (long)(this->background_work_queue_).c.
                 super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
          (lVar10 + -1 + (ulong)(ppBVar9 == (_Map_pointer)0x0)) * 0x20 == 0xfffffffffffffff)
      goto LAB_00d2859e;
      ppBVar3 = (this->background_work_queue_).c.
                super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                ._M_impl.super__Deque_impl_data._M_map;
      uVar1 = (this->background_work_queue_).c.
              super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
              ._M_impl.super__Deque_impl_data._M_map_size;
      if (uVar1 - ((long)ppBVar9 - (long)ppBVar3 >> 3) < 2) {
        if (lVar10 * 2 + 4U < uVar1) {
          __dest = (_Map_pointer)((long)ppBVar3 + (uVar1 - (lVar10 + 2) & 0xfffffffffffffffe) * 4);
          if (__dest < __src) {
            sVar7 = (long)ppBVar9 + (8 - (long)__src);
            ppBVar9 = __dest;
            if (sVar7 != 0) {
LAB_00d2849c:
              memmove(ppBVar9,__src,sVar7);
            }
          }
          else {
            sVar7 = (long)ppBVar9 + (8 - (long)__src);
            if (sVar7 != 0) {
              ppBVar9 = (_Map_pointer)((long)__dest + ((lVar10 + 1) * 8 - sVar7));
              goto LAB_00d2849c;
            }
          }
        }
        else {
          lVar8 = uVar1 * 2 + (ulong)(uVar1 == 0);
          this_00 = (PosixEnv *)(lVar8 + 2);
          if ((PosixEnv *)0xfffffffffffffff < this_00) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00d28608;
            _GLOBAL__N_1::PosixEnv::Schedule(this_00);
            iVar2 = extraout_EAX;
            goto LAB_00d28587;
          }
          ppBVar3 = (_Map_pointer)operator_new((long)this_00 * 8);
          __dest = (_Map_pointer)((long)ppBVar3 + (lVar8 - lVar10 & 0xfffffffffffffffeU) * 4);
          ppBVar9 = (this->background_work_queue_).c.
                    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          sVar7 = (long)(this->background_work_queue_).c.
                        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node + (8 - (long)ppBVar9);
          if (sVar7 != 0) {
            memmove(__dest,ppBVar9,sVar7);
          }
          operator_delete((this->background_work_queue_).c.
                          super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                          ._M_impl.super__Deque_impl_data._M_map,
                          (this->background_work_queue_).c.
                          super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                          ._M_impl.super__Deque_impl_data._M_map_size << 3);
          (this->background_work_queue_).c.
          super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
          ._M_impl.super__Deque_impl_data._M_map = ppBVar3;
          (this->background_work_queue_).c.
          super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
          ._M_impl.super__Deque_impl_data._M_map_size = (size_t)this_00;
        }
        (this->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = __dest;
        pBVar4 = *__dest;
        (this->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first = pBVar4;
        (this->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = pBVar4 + 0x20;
        (this->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = __dest + lVar10;
        pBVar4 = __dest[lVar10];
        (this->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first = pBVar4;
        (this->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last = pBVar4 + 0x20;
      }
      pBVar4 = (BackgroundWorkItem *)operator_new(0x200);
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node[1] = pBVar4;
      pBVar6 = (this->background_work_queue_).c.
               super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pBVar6->function = background_work_function;
      pBVar6->arg = background_work_arg;
      ppBVar9 = (this->background_work_queue_).c.
                super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = ppBVar9 + 1;
      pBVar6 = ppBVar9[1];
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = pBVar6;
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = pBVar6 + 0x20;
    }
    else {
      pBVar6->function = background_work_function;
      pBVar6->arg = background_work_arg;
      pBVar6 = pBVar6 + 1;
    }
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pBVar6;
    pthread_mutex_unlock((pthread_mutex_t *)&this->background_work_mutex_);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
LAB_00d28587:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00d28608;
    std::__throw_system_error(iVar2);
LAB_00d2859e:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar5 = std::__throw_length_error("cannot create std::deque larger than max_size()");
      if (local_48 != 0) {
LAB_00d285cb:
        std::terminate();
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar5);
      }
    }
  }
LAB_00d28608:
  __stack_chk_fail();
}

Assistant:

void PosixEnv::Schedule(
    void (*background_work_function)(void* background_work_arg),
    void* background_work_arg) {
  background_work_mutex_.Lock();

  // Start the background thread, if we haven't done so already.
  if (!started_background_thread_) {
    started_background_thread_ = true;
    std::thread background_thread(PosixEnv::BackgroundThreadEntryPoint, this);
    background_thread.detach();
  }

  // If the queue is empty, the background thread may be waiting for work.
  if (background_work_queue_.empty()) {
    background_work_cv_.Signal();
  }

  background_work_queue_.emplace(background_work_function, background_work_arg);
  background_work_mutex_.Unlock();
}